

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

RoundLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_round(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2ad) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2ad;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    RoundLayerParams::RoundLayerParams(this_00.round_);
    (this->layer_).round_ = (RoundLayerParams *)this_00;
  }
  return (RoundLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::RoundLayerParams* NeuralNetworkLayer::mutable_round() {
  if (!has_round()) {
    clear_layer();
    set_has_round();
    layer_.round_ = new ::CoreML::Specification::RoundLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.round)
  return layer_.round_;
}